

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

void __thiscall
ddd::DictionaryMLT<false,_true>::enumerate
          (DictionaryMLT<false,_true> *this,vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  pointer pKVar1;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *__range2;
  KvPair *prefix_kv;
  pointer prefix;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> prefix_kvs;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> local_78;
  KvPair local_58;
  
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::clear(kvs);
  if (**(long **)(this + 8) != (*(long **)(this + 8))[1]) {
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::reserve(kvs,*(size_type *)(this + 0x30))
    ;
    local_78.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.key._M_dataplus._M_p = (pointer)&local_58.key.field_2;
    local_58.key._M_string_length = 0;
    local_58.key.field_2._M_local_buf[0] = '\0';
    DaTrie<false,_true,_true>::enumerate_prefix
              (*(DaTrie<false,_true,_true> **)(this + 8),0,&local_58.key,&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pKVar1 = local_78.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (prefix = local_78.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                  super__Vector_impl_data._M_start; prefix != pKVar1; prefix = prefix + 1) {
      if ((long)(int)prefix->value < 0) {
        std::__cxx11::string::string((string *)&local_58,(string *)prefix);
        local_58.value = prefix->value & 0x80000000;
        std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::emplace_back<ddd::KvPair>
                  (kvs,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
      else {
        DaTrie<false,_true,_false>::enumerate
                  (*(DaTrie<false,_true,_false> **)
                    (*(long *)(this + 0x10) + (long)(int)prefix->value * 8),0,&prefix->key,kvs);
      }
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector(&local_78);
  }
  return;
}

Assistant:

void enumerate(std::vector<KvPair>& kvs) const {
    kvs.clear();
    if (prefix_subtrie_->is_empty()) {
      return;
    }
    kvs.reserve(num_keys_);

    std::vector<KvPair> prefix_kvs;
    prefix_subtrie_->enumerate_prefix(ROOT_POS, std::string{}, prefix_kvs);

    for (const auto& prefix_kv : prefix_kvs) {
      if ((prefix_kv.value >> 31) == 1) { // is terminal
        kvs.push_back(KvPair{prefix_kv.key, prefix_kv.value & (1U << 31)});
      } else {
        suffix_subtries_[prefix_kv.value]->enumerate(ROOT_POS, prefix_kv.key, kvs);
      }
    }
  }